

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_select(connectdata *conn)

{
  void *pvVar1;
  char *pcVar2;
  char *mailbox;
  imap_conn *imapc;
  IMAP *imap;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  (*Curl_cfree)((conn->proto).imapc.mailbox);
  (conn->proto).imapc.mailbox = (char *)0x0;
  (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
  (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  if (*(long *)((long)pvVar1 + 8) == 0) {
    Curl_failf(conn->data,"Cannot SELECT without a mailbox.");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    pcVar2 = imap_atom(*(char **)((long)pvVar1 + 8));
    if (pcVar2 == (char *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      conn_local._4_4_ = imap_sendf(conn,"SELECT %s",pcVar2);
      (*Curl_cfree)(pcVar2);
      if (conn_local._4_4_ == CURLE_OK) {
        state(conn,IMAP_SELECT);
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_select(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct IMAP *imap = data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  char *mailbox;

  /* Invalidate old information as we are switching mailboxes */
  Curl_safefree(imapc->mailbox);
  Curl_safefree(imapc->mailbox_uidvalidity);

  /* Check we have a mailbox */
  if(!imap->mailbox) {
    failf(conn->data, "Cannot SELECT without a mailbox.");
    return CURLE_URL_MALFORMAT;
  }

  /* Make sure the mailbox is in the correct atom format */
  mailbox = imap_atom(imap->mailbox);
  if(!mailbox)
    return CURLE_OUT_OF_MEMORY;

  /* Send the SELECT command */
  result = imap_sendf(conn, "SELECT %s", mailbox);

  free(mailbox);

  if(!result)
    state(conn, IMAP_SELECT);

  return result;
}